

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

MTex * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::MTex>
          (Structure *this,shared_ptr<Assimp::Blender::MTex> *out,size_t *s)

{
  MTex *__p;
  __shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __p = (MTex *)operator_new(0xc0);
  (__p->super_ElemBase).dna_type = (char *)0x0;
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__MTex_0075d288;
  (__p->object).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->object).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->tex).super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->tex).super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_ptr<Assimp::Blender::MTex,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::MTex,void>
            ((__shared_ptr<Assimp::Blender::MTex,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,__p);
  ::std::__shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28)
  ;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }